

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O0

int Abc_NtkMfsInterplateEval(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint local_38;
  int nCounter;
  uint uTruth1 [2];
  uint uTruth0 [2];
  uint *pTruth;
  int nCands_local;
  int *pCands_local;
  Mfs_Man_t *p_local;
  
  puVar5 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,0);
  if (nCands == 6) {
    local_38 = *puVar5;
    nCounter = puVar5[1];
  }
  else {
    local_38 = *puVar5;
    nCounter = *puVar5;
  }
  puVar5 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,1);
  if (nCands == 6) {
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
  }
  else {
    uVar1 = *puVar5;
    uVar2 = *puVar5;
  }
  uTruth1[1] = uVar2 ^ 0xffffffff;
  uTruth1[0] = uVar1 ^ 0xffffffff;
  iVar3 = Extra_WordCountOnes(uTruth1[0] ^ local_38);
  iVar4 = Extra_WordCountOnes(uTruth1[1] ^ nCounter);
  return iVar4 + iVar3;
}

Assistant:

int Abc_NtkMfsInterplateEval( Mfs_Man_t * p, int * pCands, int nCands )
{
    unsigned * pTruth, uTruth0[2], uTruth1[2];
    int nCounter;
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 0 );
    if ( nCands == 6 )
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[1];
    }
    else
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[0];
    }
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 1 );
    if ( nCands == 6 )
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[1];
    }
    else
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[0];
    }
    nCounter  = Extra_WordCountOnes( uTruth0[0] ^ uTruth1[0] );
    nCounter += Extra_WordCountOnes( uTruth0[1] ^ uTruth1[1] );
//    printf( "%d ", nCounter );
    return nCounter;
}